

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O2

int pkey_rsa_decrypt(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *outlen,uint8_t *in,size_t inlen)

{
  RSA_PKEY_CTX *ctx_00;
  RSA *rsa;
  int iVar1;
  uint uVar2;
  ulong max_out;
  size_t padded_len;
  
  ctx_00 = (RSA_PKEY_CTX *)ctx->data;
  rsa = *(RSA **)&((EVP_PKEY *)ctx->pkey)->references;
  iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
  max_out = (ulong)iVar1;
  if (out == (uint8_t *)0x0) {
    *outlen = max_out;
    uVar2 = 1;
  }
  else if (*outlen < max_out) {
    uVar2 = 0;
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x137);
  }
  else if (ctx_00->pad_mode == 4) {
    iVar1 = setup_tbuf(ctx_00,ctx);
    uVar2 = 0;
    if ((iVar1 != 0) &&
       (iVar1 = RSA_decrypt(rsa,&padded_len,ctx_00->tbuf,max_out,in,inlen,3), iVar1 != 0)) {
      iVar1 = RSA_padding_check_PKCS1_OAEP_mgf1
                        (out,outlen,max_out,ctx_00->tbuf,padded_len,ctx_00->oaep_label,
                         ctx_00->oaep_labellen,ctx_00->md,ctx_00->mgf1md);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  else {
    uVar2 = RSA_decrypt(rsa,outlen,out,max_out,in,inlen,ctx_00->pad_mode);
  }
  return uVar2;
}

Assistant:

static int pkey_rsa_decrypt(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *outlen,
                            const uint8_t *in, size_t inlen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);
  const size_t key_len = EVP_PKEY_size(ctx->pkey);

  if (!out) {
    *outlen = key_len;
    return 1;
  }

  if (*outlen < key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (rctx->pad_mode == RSA_PKCS1_OAEP_PADDING) {
    size_t padded_len;
    if (!setup_tbuf(rctx, ctx) ||
        !RSA_decrypt(rsa, &padded_len, rctx->tbuf, key_len, in, inlen,
                     RSA_NO_PADDING) ||
        !RSA_padding_check_PKCS1_OAEP_mgf1(
            out, outlen, key_len, rctx->tbuf, padded_len, rctx->oaep_label,
            rctx->oaep_labellen, rctx->md, rctx->mgf1md)) {
      return 0;
    }
    return 1;
  }

  return RSA_decrypt(rsa, outlen, out, key_len, in, inlen, rctx->pad_mode);
}